

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_i4rescale(fitsfile *infptr,int naxis,long *naxes,double rescale,fitsfile *outfptr,int *status
                )

{
  int iVar1;
  size_t sVar2;
  fitsfile *pfVar3;
  int iVar4;
  void *__ptr;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  int nullvalue;
  double local_60;
  fitsfile *local_58;
  fitsfile *local_50;
  size_t local_48;
  long local_40;
  int tstatus;
  int anynul;
  
  sVar2 = *naxes;
  lVar6 = 1;
  lVar9 = lVar6;
  for (; lVar6 < naxis; lVar6 = lVar6 + 1) {
    lVar9 = lVar9 * naxes[lVar6];
  }
  local_60 = rescale;
  local_58 = infptr;
  local_50 = outfptr;
  __ptr = calloc(sVar2,4);
  pfVar3 = local_58;
  if (__ptr == (void *)0x0) {
    *status = 0x71;
    iVar4 = 0x71;
  }
  else {
    tstatus = 0;
    lVar6 = 0;
    ffgky(local_58,0x1f,"BLANK",&nullvalue,0,&tstatus);
    iVar4 = tstatus;
    ffpscl(0x3ff0000000000000,0,pfVar3,status);
    ffpscl(0x3ff0000000000000,0,local_50,status);
    sVar7 = 0;
    if (0 < (long)sVar2) {
      sVar7 = sVar2;
    }
    if (lVar9 < 1) {
      lVar9 = lVar6;
    }
    lVar8 = 1;
    local_48 = sVar2;
    while (lVar6 != lVar9) {
      ffgpvk(local_58,1,lVar8,local_48,0,__ptr,&anynul,status);
      sVar2 = local_48;
      if (iVar4 == 0) {
        for (sVar5 = 0; sVar7 != sVar5; sVar5 = sVar5 + 1) {
          iVar1 = *(int *)((long)__ptr + sVar5 * 4);
          if (iVar1 != nullvalue) {
            dVar10 = (double)iVar1 / local_60;
            *(int *)((long)__ptr + sVar5 * 4) =
                 (int)(dVar10 + *(double *)(&DAT_001095a0 + (ulong)(dVar10 < 0.0) * 8));
          }
        }
      }
      else {
        for (sVar5 = 0; sVar7 != sVar5; sVar5 = sVar5 + 1) {
          dVar10 = (double)*(int *)((long)__ptr + sVar5 * 4) / local_60;
          *(int *)((long)__ptr + sVar5 * 4) =
               (int)(dVar10 + *(double *)(&DAT_001095a0 + (ulong)(dVar10 < 0.0) * 8));
        }
      }
      local_40 = lVar6;
      ffpprk(local_50,1,lVar8,local_48,__ptr,status);
      lVar8 = lVar8 + sVar2;
      lVar6 = local_40 + 1;
    }
    free(__ptr);
    iVar4 = *status;
  }
  return iVar4;
}

Assistant:

int fp_i4rescale(fitsfile *infptr, int naxis, long *naxes, double rescale,
    fitsfile *outfptr, int *status)
{
/*
    divide the integer pixel values in the input file by rescale,
    and write back out to the output file..
*/

	long ii, jj, nelem = 1, nx, ny;
	int *intarray, nullvalue;
	int anynul, tstatus, checknull = 1;
	
	nx = naxes[0];
	ny = 1;
	
	for (ii = 1; ii < naxis; ii++) {
	    ny = ny * naxes[ii];
	}

	intarray = calloc(nx, sizeof(int));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TINT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   checknull = 0;
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr,  1.0, 0.0, status);
	fits_set_bscale(outfptr, 1.0, 0.0, status);

	for (ii = 0; ii < ny; ii++) {

	    fits_read_img_int(infptr, 1, nelem, nx,
	        0, intarray, &anynul, status);

	    if (checknull) {
	        for (jj = 0; jj < nx; jj++) {
	            if (intarray[jj] != nullvalue)
		        intarray[jj] = NINT( (intarray[jj] / rescale) );
		}
	    } else {
	        for (jj = 0; jj < nx; jj++)
		        intarray[jj] = NINT( (intarray[jj] / rescale) );
	    }

	    fits_write_img_int(outfptr, 1, nelem, nx, intarray, status);
	      
	    nelem += nx;
	}

	free(intarray);
	return(*status);
}